

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::Token> * __thiscall
tinyusdz::primvar::PrimVar::get_ts_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,PrimVar *this,size_t idx)

{
  value_type *this_00;
  optional<tinyusdz::value::Value> pv;
  optional<tinyusdz::value::Value> local_60;
  optional<tinyusdz::Token> local_40;
  
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  }
  else {
    tinyusdz::value::TimeSamples::get_value
              ((optional<tinyusdz::value::Value> *)&local_40,&this->_ts,idx);
    nonstd::optional_lite::optional<tinyusdz::value::Value>::optional<tinyusdz::value::Value,_0>
              (&local_60,(optional<tinyusdz::value::Value> *)&local_40);
    nonstd::optional_lite::optional<tinyusdz::value::Value>::~optional
              ((optional<tinyusdz::value::Value> *)&local_40);
    if (local_60.has_value_ == false) {
      __return_storage_ptr__->has_value_ = false;
      *(undefined8 *)&__return_storage_ptr__->contained = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    }
    else {
      this_00 = nonstd::optional_lite::optional<tinyusdz::value::Value>::value(&local_60);
      tinyusdz::value::Value::get_value<tinyusdz::Token>(&local_40,this_00,false);
      nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                (__return_storage_ptr__,&local_40);
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_40);
    }
    nonstd::optional_lite::optional<tinyusdz::value::Value>::~optional(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_ts_value(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    nonstd::optional<value::Value> pv = _ts.get_value(idx);
    if (!pv) {
      return nonstd::nullopt;
    }

    return pv.value().get_value<T>();
  }